

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O2

void test_rgb2yuv(uint32_t width,uint32_t height,uint8_t *rgb,uint32_t rgb_stride,uint8_t *y,
                 uint8_t *u,uint8_t *v,uint32_t y_stride,uint32_t uv_stride,YCbCrType yuv_type,
                 char *file,char *name,uint32_t iteration_number,rgb2yuv_ptr rgb2yuv_fun)

{
  clock_t cVar1;
  clock_t cVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  bool bVar5;
  
  cVar1 = clock();
  while (bVar5 = iteration_number != 0, iteration_number = iteration_number - 1, bVar5) {
    (*rgb2yuv_fun)(width,height,rgb,rgb_stride,y,u,v,y_stride,uv_stride,yuv_type);
  }
  cVar2 = clock();
  printf("Processing time (%s) : %f sec\n",(double)((float)(cVar2 - cVar1) / 1e+06),name);
  sVar3 = strlen(file);
  sVar4 = strlen(name);
  __dest = (char *)malloc(sVar3 + sVar4 + 6);
  strcpy(__dest,file);
  sVar3 = strlen(__dest);
  (__dest + sVar3)[0] = '_';
  (__dest + sVar3)[1] = '\0';
  strcat(__dest,name);
  sVar3 = strlen(__dest);
  builtin_strncpy(__dest + sVar3,".yuv",5);
  saveRawYUV(__dest,width,height,y,(ulong)y_stride,(ulong)uv_stride);
  free(__dest);
  return;
}

Assistant:

void test_rgb2yuv(uint32_t width, uint32_t height, 
	const uint8_t *rgb, uint32_t rgb_stride, 
	uint8_t *y, uint8_t *u, uint8_t *v, uint32_t y_stride, uint32_t uv_stride, YCbCrType yuv_type,
	const char *file, const char *name, uint32_t iteration_number, const rgb2yuv_ptr rgb2yuv_fun)
{
	clock_t t = clock();
	for(uint32_t i=0;i<iteration_number; ++i)
		rgb2yuv_fun(width, height, rgb, rgb_stride, y, u, v, y_stride, uv_stride, yuv_type);
	t = clock()-t;
	printf("Processing time (%s) : %f sec\n", name, ((float)t)/CLOCKS_PER_SEC);
	
	char *out_filename = malloc(strlen(file)+strlen(name)+6);
	strcpy(out_filename, file);
	strcat(out_filename, "_");
	strcat(out_filename, name);
	strcat(out_filename, ".yuv");
	saveRawYUV(out_filename, width, height, y, y_stride, uv_stride);
	free(out_filename);
}